

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O1

HighsStatus __thiscall
Highs::setSolution(Highs *this,HighsInt num_entries,HighsInt *index,double *value)

{
  HighsLogOptions *log_options_;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *this_00;
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  bool bVar5;
  HighsStatus call_status;
  HighsStatus HVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  bool bVar10;
  vector<bool,_std::allocator<bool>_> is_set;
  HighsSolution new_solution;
  ulong local_168;
  vector<bool,_std::allocator<bool>_> local_148;
  string local_120;
  HighsSolution local_100;
  HighsLogOptions local_98;
  
  local_148.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_148.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_148.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_148.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_168 = 0;
  local_148.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  std::vector<bool,_std::allocator<bool>_>::_M_fill_assign
            (&local_148,(long)(this->model_).lp_.num_col_,false);
  bVar10 = 0 < num_entries;
  if (0 < num_entries) {
    log_options_ = &(this->options_).super_HighsOptionsStruct.log_options;
    uVar7 = 0;
    local_168 = 0;
    do {
      uVar4 = index[uVar7];
      uVar8 = (ulong)uVar4;
      if ((this->model_).lp_.num_col_ < (int)uVar4 || (int)uVar4 < 0) {
        bVar5 = false;
        highsLogUser(log_options_,kError,
                     "setSolution: User solution index %d has value %d out of range [0, %d)",
                     uVar7 & 0xffffffff);
      }
      else {
        dVar1 = value[uVar7];
        dVar2 = (this->model_).lp_.col_lower_.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar8];
        dVar3 = (this->options_).super_HighsOptionsStruct.primal_feasibility_tolerance;
        if ((dVar1 < dVar2 - dVar3) ||
           (dVar3 + (this->model_).lp_.col_upper_.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar8] < dVar1)) {
          highsLogUser(log_options_,kError,
                       "setSolution: User solution value %d of %g is infeasible for bounds [%g, %g]"
                       ,dVar1,dVar2,
                       (this->model_).lp_.col_upper_.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar8],uVar7 & 0xffffffff);
          bVar5 = false;
        }
        else {
          local_168 = (ulong)((int)local_168 +
                             (uint)((local_148.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                     [uVar4 >> 6] >> (uVar8 & 0x3f) & 1) != 0));
          local_148.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p[uVar4 >> 6] =
               local_148.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_start.super__Bit_iterator_base._M_p[uVar4 >> 6] | 1L << (uVar8 & 0x3f);
          bVar5 = true;
        }
      }
      if (!bVar5) break;
      uVar7 = uVar7 + 1;
      bVar10 = uVar7 < (uint)num_entries;
    } while (uVar7 != (uint)num_entries);
  }
  HVar6 = kError;
  if (!bVar10) {
    if ((int)local_168 < 1) {
      HVar6 = kOk;
    }
    else {
      pcVar9 = "s";
      if ((int)local_168 == 1) {
        pcVar9 = "";
      }
      HVar6 = kWarning;
      highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kWarning,
                   "setSolution: User set of indices has %d duplicate%s: last value used\n",
                   local_168,pcVar9);
    }
    local_100.value_valid = false;
    local_100.dual_valid = false;
    local_100.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_100.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_100.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_100.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_100.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_100.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_100.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_100.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_100.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_100.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_100.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_100.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&local_100.col_value,(long)(this->model_).lp_.num_col_,
               (value_type_conflict1 *)&kHighsUndefined);
    if (0 < num_entries) {
      uVar7 = 0;
      do {
        local_100.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[index[uVar7]] = value[uVar7];
        uVar7 = uVar7 + 1;
      } while ((uint)num_entries != uVar7);
    }
    local_98.log_stream = (this->options_).super_HighsOptionsStruct.log_options.log_stream;
    local_98.output_flag = (this->options_).super_HighsOptionsStruct.log_options.output_flag;
    local_98.log_to_console = (this->options_).super_HighsOptionsStruct.log_options.log_to_console;
    local_98.log_dev_level = (this->options_).super_HighsOptionsStruct.log_options.log_dev_level;
    local_98.user_log_callback =
         (this->options_).super_HighsOptionsStruct.log_options.user_log_callback;
    local_98.user_log_callback_data =
         (this->options_).super_HighsOptionsStruct.log_options.user_log_callback_data;
    this_00 = &local_98.user_callback;
    std::
    function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
    ::function(this_00,&(this->options_).super_HighsOptionsStruct.log_options.user_callback);
    local_98.user_callback_active =
         (this->options_).super_HighsOptionsStruct.log_options.user_callback_active;
    local_98.user_callback_data =
         (this->options_).super_HighsOptionsStruct.log_options.user_callback_data;
    call_status = setSolution(this,&local_100);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"setSolution","");
    HVar6 = interpretCallStatus(&local_98,call_status,HVar6,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    if (local_98.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_98.user_callback.super__Function_base._M_manager)
                ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
    }
    if (local_100.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_100.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl
                      .super__Vector_impl_data._M_start);
    }
    if (local_100.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_100.row_value.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_100.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_100.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl
                      .super__Vector_impl_data._M_start);
    }
    if (local_100.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_100.col_value.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_148.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_148.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return HVar6;
}

Assistant:

HighsStatus Highs::setSolution(const HighsInt num_entries,
                               const HighsInt* index, const double* value) {
  HighsStatus return_status = HighsStatus::kOk;
  // Warn about duplicates in index
  HighsInt num_duplicates = 0;
  std::vector<bool> is_set;
  is_set.assign(model_.lp_.num_col_, false);
  for (HighsInt iX = 0; iX < num_entries; iX++) {
    HighsInt iCol = index[iX];
    if (iCol < 0 || iCol > model_.lp_.num_col_) {
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "setSolution: User solution index %d has value %d out of "
                   "range [0, %d)",
                   int(iX), int(iCol), int(model_.lp_.num_col_));
      return HighsStatus::kError;
    } else if (value[iX] < model_.lp_.col_lower_[iCol] -
                               options_.primal_feasibility_tolerance ||
               model_.lp_.col_upper_[iCol] +
                       options_.primal_feasibility_tolerance <
                   value[iX]) {
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "setSolution: User solution value %d of %g is infeasible "
                   "for bounds [%g, %g]",
                   int(iX), value[iX], model_.lp_.col_lower_[iCol],
                   model_.lp_.col_upper_[iCol]);
      return HighsStatus::kError;
    }
    if (is_set[iCol]) num_duplicates++;
    is_set[iCol] = true;
  }
  if (num_duplicates > 0) {
    highsLogUser(options_.log_options, HighsLogType::kWarning,
                 "setSolution: User set of indices has %d duplicate%s: last "
                 "value used\n",
                 int(num_duplicates), num_duplicates > 1 ? "s" : "");
    return_status = HighsStatus::kWarning;
  }

  // Clear the solution, indicate the values not determined by the
  // user, and insert the values determined by the user
  HighsSolution new_solution;
  new_solution.col_value.assign(model_.lp_.num_col_, kHighsUndefined);
  for (HighsInt iX = 0; iX < num_entries; iX++) {
    HighsInt iCol = index[iX];
    new_solution.col_value[iCol] = value[iX];
  }
  return interpretCallStatus(options_.log_options, setSolution(new_solution),
                             return_status, "setSolution");
}